

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O2

int opj_getopt(int nargc,char **nargv,char *ostr)

{
  char *pcVar1;
  long lVar2;
  uint __c;
  char *pcVar3;
  char cVar4;
  
  if ((opj_optreset != 0) || (cVar4 = *opj_getopt::place, cVar4 == '\0')) {
    opj_optreset = 0;
    if ((nargc <= opj_optind) || (opj_getopt::place = nargv[opj_optind], *opj_getopt::place != '-'))
    {
LAB_0010df66:
      opj_getopt::place = EMSG;
      opj_optreset = 0;
      return -1;
    }
    cVar4 = opj_getopt::place[1];
    if (cVar4 == '\0') {
      cVar4 = '-';
    }
    else {
      if (cVar4 == '-') {
        opj_optind = opj_optind + 1;
        goto LAB_0010df66;
      }
      opj_getopt::place = opj_getopt::place + 1;
    }
  }
  pcVar3 = opj_getopt::place + 1;
  __c = (uint)cVar4;
  opj_getopt::place = pcVar3;
  opj_optopt = __c;
  if (cVar4 != ':') {
    pcVar1 = strchr(ostr,__c);
    if (pcVar1 != (char *)0x0) {
      if (pcVar1[1] != ':') {
        if (*pcVar3 == '\0') {
          opj_optind = opj_optind + 1;
          opj_optarg = (char *)0x0;
          return __c;
        }
        opj_optarg = (char *)0x0;
        return __c;
      }
      if (*pcVar3 != '\0') {
LAB_0010e084:
        opj_optarg = pcVar3;
        opj_getopt::place = EMSG;
        opj_optind = opj_optind + 1;
        return __c;
      }
      lVar2 = (long)opj_optind;
      opj_optind = opj_optind + 1;
      if (opj_optind < nargc) {
        pcVar3 = nargv[lVar2 + 1];
        goto LAB_0010e084;
      }
      opj_getopt::place = EMSG;
      if (*ostr == ':') {
        return 0x3a;
      }
      pcVar3 = opj_optarg;
      if (opj_opterr == 0) goto LAB_0010e084;
      pcVar3 = *nargv;
      pcVar1 = "%s: option requires an argument -- %c\n";
      goto LAB_0010e010;
    }
    if (cVar4 == '-') {
      return -1;
    }
  }
  if (*pcVar3 == '\0') {
    opj_optind = opj_optind + 1;
  }
  pcVar3 = *nargv;
  pcVar1 = "%s: illegal option -- %c\n";
LAB_0010e010:
  fprintf(_stderr,pcVar1,pcVar3,(ulong)__c);
  return 0x3f;
}

Assistant:

int opj_getopt(int nargc, char *const *nargv, const char *ostr)
{
#  define __progname nargv[0]
    static char *place = EMSG;    /* option letter processing */
    const char *oli = NULL;   /* option letter list index */

    if (opj_optreset || !*place) {    /* update scanning pointer */
        opj_optreset = 0;
        if (opj_optind >= nargc || *(place = nargv[opj_optind]) != '-') {
            place = EMSG;
            return (-1);
        }
        if (place[1] && *++place == '-') {  /* found "--" */
            ++opj_optind;
            place = EMSG;
            return (-1);
        }
    }             /* option letter okay? */
    if ((opj_optopt = (int) * place++) == (int) ':' ||
            !(oli = strchr(ostr, opj_optopt))) {
        /*
         * if the user didn't specify '-' as an option,
         * assume it means -1.
         */
        if (opj_optopt == (int) '-') {
            return (-1);
        }
        if (!*place) {
            ++opj_optind;
        }
        if (opj_opterr && *ostr != ':') {
            fprintf(stderr,
                    "%s: illegal option -- %c\n", __progname, opj_optopt);
            return (BADCH);
        }
    }
    if (*++oli != ':') {      /* don't need argument */
        opj_optarg = NULL;
        if (!*place) {
            ++opj_optind;
        }
    } else {          /* need an argument */
        if (*place) {       /* no white space */
            opj_optarg = place;
        } else if (nargc <= ++opj_optind) { /* no arg */
            place = EMSG;
            if (*ostr == ':') {
                return (BADARG);
            }
            if (opj_opterr) {
                fprintf(stderr,
                        "%s: option requires an argument -- %c\n",
                        __progname, opj_optopt);
                return (BADCH);
            }
        } else {        /* white space */
            opj_optarg = nargv[opj_optind];
        }
        place = EMSG;
        ++opj_optind;
    }
    return (opj_optopt);      /* dump back option letter */
}